

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  
  if (s->length_ != 0) {
    bVar1 = *s->ptr_;
    if ((bVar1 - 0x30 < 10) && ((bVar1 != 0x30 || s->length_ < 2 || (9 < (byte)s->ptr_[1] - 0x30))))
    {
      if (s->length_ < 1) {
        iVar4 = 0;
      }
      else {
        iVar3 = s->length_ + 1;
        iVar4 = 0;
        pbVar2 = (byte *)s->ptr_;
        do {
          if (9 < *pbVar2 - 0x30) break;
          if (99999999 < iVar4) {
            return false;
          }
          iVar4 = (uint)*pbVar2 + iVar4 * 10 + -0x30;
          s->ptr_ = (char *)(pbVar2 + 1);
          s->length_ = iVar3 + -2;
          iVar3 = iVar3 + -1;
          pbVar2 = pbVar2 + 1;
        } while (1 < iVar3);
      }
      *np = iVar4;
      return true;
    }
  }
  return false;
}

Assistant:

int size() const { return length_; }